

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.h
# Opt level: O3

qint64 __thiscall QCborValueConstRef::toInteger(QCborValueConstRef *this,qint64 defaultValue)

{
  qsizetype in_RCX;
  long in_FS_OFFSET;
  QCborValueConstRef self;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  self.i = in_RCX;
  self.d = (QCborContainerPrivate *)this->i;
  concrete(&local_30,(QCborValueConstRef *)this->d,self);
  if (local_30.t == Double) {
    defaultValue = (qint64)(double)local_30.n;
  }
  else if (local_30.t == Integer) {
    defaultValue = local_30.n;
  }
  QCborValue::~QCborValue((QCborValue *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (qint64)(double)defaultValue;
  }
  __stack_chk_fail();
}

Assistant:

qint64 toInteger(qint64 defaultValue = 0) const
    { return concrete().toInteger(defaultValue); }